

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O1

Float * __thiscall blc::math::Float::operator=(Float *this,Float *other)

{
  this->_nb = other->_nb;
  this->_E = other->_E;
  other->_nb = 0.0;
  other->_E = 0;
  return this;
}

Assistant:

blc::math::Float &blc::math::Float::operator=(blc::math::Float &&other) {
	this->_nb = other.getNb();
	this->_E = other.getE();

	other.setNb(0);
	other.setE(0);
	return (*this);
}